

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O0

MppDevBatServ * __thiscall
MppDevServer::bat_server_get(MppDevServer *this,MppClientType client_type)

{
  int iVar1;
  char *pcVar2;
  __pthread_internal_list *p_Var3;
  Mutex *pMVar4;
  char local_68 [8];
  char timer_name [32];
  undefined1 local_38 [8];
  AutoMutex auto_lock;
  MppDevBatServ *server;
  MppClientType client_type_local;
  MppDevServer *this_local;
  
  auto_lock.mLock = (Mutex *)0x0;
  Mutex::Autolock::Autolock((Autolock *)local_38,&this->super_Mutex,1);
  auto_lock.mLock = (Mutex *)this->mBatServer[client_type];
  this_local = (MppDevServer *)auto_lock.mLock;
  if ((MppDevServer *)auto_lock.mLock == (MppDevServer *)0x0) {
    auto_lock.mLock = (Mutex *)mpp_osal_calloc("bat_server_get",0x90);
    if (auto_lock.mLock == (Mutex *)0x0) {
      _mpp_log_l(2,"mpp_server","mpp server failed to get bat server\n",(char *)0x0);
      this_local = (MppDevServer *)0x0;
    }
    else {
      iVar1 = open(this->mServerName,0x80002);
      ((auto_lock.mLock)->mMutex).__data.__owner = iVar1;
      if (((auto_lock.mLock)->mMutex).__data.__owner < 0) {
        _mpp_log_l(2,"mpp_server","mpp server get bat server failed to open device\n",(char *)0x0);
      }
      else {
        pcVar2 = strof_client_type(client_type);
        snprintf(local_68,0x1f,"%s_bat",pcVar2);
        p_Var3 = (__pthread_internal_list *)mpp_timer_get(local_68);
        ((auto_lock.mLock)->mMutex).__data.__list.__prev = p_Var3;
        if (((auto_lock.mLock)->mMutex).__data.__list.__prev == (__pthread_internal_list *)0x0) {
          _mpp_log_l(2,"mpp_server","mpp server get bat server failed to create timer\n",(char *)0x0
                    );
        }
        else {
          pMVar4 = (Mutex *)operator_new(0x28);
          Mutex::Mutex(pMVar4);
          *(Mutex **)&(auto_lock.mLock)->mMutex = pMVar4;
          if (((auto_lock.mLock)->mMutex).__align != 0) {
            mpp_timer_set_callback
                      (((auto_lock.mLock)->mMutex).__data.__list.__prev,mpp_server_thread,
                       auto_lock.mLock);
            mpp_timer_set_timing(((auto_lock.mLock)->mMutex).__data.__list.__prev,10,10);
            ((auto_lock.mLock)->mMutex).__data.__list.__next =
                 (__pthread_internal_list *)((long)&(auto_lock.mLock)->mMutex + 0x20);
            auto_lock.mLock[1].mMutex.__align = (long)((long)&(auto_lock.mLock)->mMutex + 0x20);
            *(undefined1 **)((long)&auto_lock.mLock[1].mMutex + 0x10) =
                 (undefined1 *)((long)&auto_lock.mLock[1].mMutex + 0x10);
            auto_lock.mLock[1].mMutex.__data.__list.__prev =
                 (__pthread_internal_list *)((long)&auto_lock.mLock[1].mMutex + 0x10);
            auto_lock.mLock[1].mMutex.__data.__list.__next =
                 (__pthread_internal_list *)((long)&auto_lock.mLock[1].mMutex + 0x20);
            auto_lock.mLock[2].mMutex.__align = (long)((long)&auto_lock.mLock[1].mMutex + 0x20);
            auto_lock.mLock[3].mMutex.__align = (long)(auto_lock.mLock + 3);
            *(Mutex **)((long)&auto_lock.mLock[3].mMutex + 8) = auto_lock.mLock + 3;
            *(MppMemPool *)((long)&auto_lock.mLock[2].mMutex + 8) = this->mBatchPool;
            *(RK_S32 *)((long)&auto_lock.mLock[2].mMutex + 0x20) = this->mMaxTaskInBatch;
            this->mBatServer[client_type] = (MppDevBatServ *)auto_lock.mLock;
            this_local = (MppDevServer *)auto_lock.mLock;
            goto LAB_00196a4e;
          }
          _mpp_log_l(2,"mpp_server","mpp server get bat server failed to create mutex\n",(char *)0x0
                    );
        }
      }
      if (auto_lock.mLock != (Mutex *)0x0) {
        if (((auto_lock.mLock)->mMutex).__data.__list.__prev != (__pthread_internal_list *)0x0) {
          mpp_timer_put(((auto_lock.mLock)->mMutex).__data.__list.__prev);
          ((auto_lock.mLock)->mMutex).__data.__list.__prev = (__pthread_internal_list *)0x0;
        }
        if (-1 < ((auto_lock.mLock)->mMutex).__data.__owner) {
          close(((auto_lock.mLock)->mMutex).__data.__owner);
          ((auto_lock.mLock)->mMutex).__data.__owner = -1;
        }
        if (((auto_lock.mLock)->mMutex).__align != 0) {
          pMVar4 = (Mutex *)((auto_lock.mLock)->mMutex).__align;
          if (pMVar4 != (Mutex *)0x0) {
            Mutex::~Mutex(pMVar4);
            operator_delete(pMVar4,0x28);
          }
          ((auto_lock.mLock)->mMutex).__align = 0;
        }
      }
      if (auto_lock.mLock != (Mutex *)0x0) {
        mpp_osal_free("bat_server_get",auto_lock.mLock);
      }
      auto_lock.mLock = (Mutex *)0x0;
      this_local = (MppDevServer *)0x0;
    }
  }
LAB_00196a4e:
  Mutex::Autolock::~Autolock((Autolock *)local_38);
  return (MppDevBatServ *)this_local;
}

Assistant:

MppDevBatServ *MppDevServer::bat_server_get(MppClientType client_type)
{
    MppDevBatServ *server = NULL;

    AutoMutex auto_lock(this);

    server = mBatServer[client_type];
    if (server)
        return server;

    server = mpp_calloc(MppDevBatServ, 1);
    if (NULL == server) {
        mpp_err("mpp server failed to get bat server\n");
        return NULL;
    }

    server->server_fd = open(mServerName, O_RDWR | O_CLOEXEC);
    if (server->server_fd < 0) {
        mpp_err("mpp server get bat server failed to open device\n");
        goto failed;
    }

    char timer_name[32];

    snprintf(timer_name, sizeof(timer_name) - 1, "%s_bat",
             strof_client_type(client_type));

    server->timer = mpp_timer_get(timer_name);
    if (NULL == server->timer) {
        mpp_err("mpp server get bat server failed to create timer\n");
        goto failed;
    }

    server->lock = new Mutex();
    if (NULL == server->lock) {
        mpp_err("mpp server get bat server failed to create mutex\n");
        goto failed;
    }

    mpp_timer_set_callback(server->timer, mpp_server_thread, server);
    /* 10ms */
    mpp_timer_set_timing(server->timer, 10, 10);

    INIT_LIST_HEAD(&server->session_list);
    INIT_LIST_HEAD(&server->list_batch);
    INIT_LIST_HEAD(&server->list_batch_free);
    INIT_LIST_HEAD(&server->pending_task);

    server->batch_pool = mBatchPool;
    server->max_task_in_batch = mMaxTaskInBatch;

    mBatServer[client_type] = server;
    return server;

failed:
    if (server) {
        if (server->timer) {
            mpp_timer_put(server->timer);
            server->timer = NULL;
        }

        if (server->server_fd >= 0) {
            close(server->server_fd);
            server->server_fd = -1;
        }
        if (server->lock) {
            delete server->lock;
            server->lock = NULL;
        }
    }
    MPP_FREE(server);
    return server;
}